

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_delegate.cc
# Opt level: O0

void absl::lts_20240722::base_internal::ThrowStdLengthError(string *what_arg)

{
  length_error *this;
  string *what_arg_local;
  
  this = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this,(string *)what_arg);
  __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void ThrowStdLengthError(const std::string& what_arg) {
#ifdef ABSL_HAVE_EXCEPTIONS
  throw std::length_error(what_arg);
#else
  ABSL_RAW_LOG(FATAL, "%s", what_arg.c_str());
  std::abort();
#endif
}